

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContextInit.cpp
# Opt level: O0

ContextInitializer * __thiscall
Imf_3_4::ContextInitializer::setInputStream(ContextInitializer *this,IStream *istr)

{
  uint uVar1;
  void *pvVar2;
  IStream *in_RSI;
  ContextInitializer *in_RDI;
  IStream *in_stack_ffffffffffffffc8;
  
  pvVar2 = operator_new(0x30);
  istream_holder::istream_holder((istream_holder *)in_RDI,in_stack_ffffffffffffffc8);
  (in_RDI->_initializer).user_data = pvVar2;
  uVar1 = (*in_RSI->_vptr_IStream[9])();
  if ((uVar1 & 1) == 0) {
    (in_RDI->_initializer).read_fn = istream_nonparallel_read;
  }
  else {
    (in_RDI->_initializer).read_fn = istream_threadsafe_read;
  }
  (in_RDI->_initializer).size_fn = istream_size;
  (in_RDI->_initializer).write_fn = (exr_write_func_ptr_t)0x0;
  (in_RDI->_initializer).destroy_fn = istream_destroy;
  in_RDI->_ctxt_type = READ;
  in_RDI->_prov_stream = in_RSI;
  return in_RDI;
}

Assistant:

ContextInitializer&
ContextInitializer::setInputStream (IStream* istr)
{
    _initializer.user_data  = new istream_holder{istr};
    if (istr->isStatelessRead ())
        _initializer.read_fn = istream_threadsafe_read;
    else
        _initializer.read_fn = istream_nonparallel_read;
    _initializer.size_fn    = istream_size;
    _initializer.write_fn   = nullptr;
    _initializer.destroy_fn = istream_destroy;
    _ctxt_type              = ContextFileType::READ;
    _prov_stream            = istr;
    return *this;
}